

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

MIR_op_mode_t MIR_insn_op_mode(MIR_context_t ctx,MIR_insn_t_conflict insn,size_t nop,int *out_p)

{
  byte bVar1;
  MIR_label_t pMVar2;
  VARR_MIR_proto_t *pVVar3;
  MIR_proto_t pMVar4;
  VARR_MIR_var_t *varr;
  long *plVar5;
  size_t *psVar6;
  size_t sVar7;
  MIR_insn_t pMVar8;
  uint uVar9;
  int iVar10;
  MIR_proto_t *ppMVar11;
  void *pvVar12;
  undefined8 *extraout_RDX;
  MIR_proto_t *unaff_RBX;
  size_t sVar13;
  ulong uVar14;
  size_t sVar15;
  ulong unaff_RBP;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 *unaff_R14;
  int aiStack_78 [2];
  reg_desc_t rStack_70;
  MIR_var_t local_28;
  
  if (insn == (MIR_insn_t_conflict)0x0) {
    __assert_fail("insn != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x816,"size_t MIR_insn_nops(MIR_context_t, MIR_insn_t)");
  }
  uVar16 = *(ulong *)&insn->field_0x18;
  uVar17 = uVar16 >> 0x20;
  *out_p = 0;
  if (uVar17 <= nop) {
    return MIR_OP_BOUND;
  }
  iVar10 = (int)uVar16;
  if (iVar10 < 0xaa) {
    if (3 < iVar10 - 0x1eU) {
      if (iVar10 - 0xa7U < 2) {
        if ((insn->ops[0].field_0x8 != '\b') ||
           (pMVar2 = insn->ops[0].u.label, *(int *)&pMVar2->ops[0].data != 1)) {
          __assert_fail("proto_op.mode == MIR_OP_REF && proto_op.u.ref->item_type == MIR_proto_item"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                        ,0x848,
                        "MIR_op_mode_t MIR_insn_op_mode(MIR_context_t, MIR_insn_t, size_t, int *)");
        }
        ppMVar11 = (MIR_proto_t *)((long)&pMVar2->ops[0].u + 0x10);
        uVar16 = 2;
LAB_00132cb7:
        pMVar4 = *ppMVar11;
        uVar9 = 0;
        if (uVar16 <= nop) {
          uVar9 = (uint)(nop < pMVar4->nres + uVar16);
        }
        *out_p = uVar9;
        uVar18 = pMVar4->nres + uVar16;
        varr = pMVar4->args;
        if (varr == (VARR_MIR_var_t *)0x0) {
          sVar13 = 0;
        }
        else {
          sVar13 = varr->els_num;
        }
        uVar14 = sVar13 + uVar18;
        if ((pMVar4->vararg_p != '\0') && (uVar14 <= nop)) {
          return MIR_OP_UNDEF;
        }
        if ((uVar17 < uVar14) || ((pMVar4->vararg_p == '\0' && (uVar17 != uVar14)))) {
          __assert_fail("nops >= nargs && (proto->vararg_p || nops == nargs)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                        ,0x84f,
                        "MIR_op_mode_t MIR_insn_op_mode(MIR_context_t, MIR_insn_t, size_t, int *)");
        }
        if (nop == 0) {
          return (uint)(byte)insn->ops[0].field_0x8;
        }
        if (nop == 1 && iVar10 != 0xb5) {
          return MIR_OP_INT;
        }
        if ((nop < uVar16) || (uVar18 <= nop)) {
          VARR_MIR_var_tget(&local_28,varr,nop - uVar18);
        }
        else {
          local_28.type = pMVar4->res_types[nop - uVar16];
        }
        if (local_28.type == MIR_T_F) {
          return MIR_OP_FLOAT;
        }
        if (local_28.type == MIR_T_D) {
          return MIR_OP_DOUBLE;
        }
        if (local_28.type == MIR_T_UNDEF) {
          return MIR_OP_UNDEF;
        }
        return (uint)(local_28.type == MIR_T_LD) * 4 + MIR_OP_INT;
      }
LAB_00132d4b:
      bVar1 = *(byte *)(nop + (uVar16 & 0xffffffff) * 0x18 + 0x1e3b40);
      if (-1 < (char)bVar1) {
        return (uint)bVar1;
      }
      *out_p = 1;
      return bVar1 & 0x7f;
    }
    *out_p = (uint)(nop == 0);
    if (nop == 0) {
      return MIR_OP_INT;
    }
LAB_00132c5e:
    return (uint)(byte)insn->ops[nop].field_0x8;
  }
  if (0xb8 < iVar10) {
    if (iVar10 != 0xb9) {
      if (iVar10 != 0xba) goto LAB_00132d4b;
      *out_p = (uint)(nop == 0);
    }
    goto LAB_00132c5e;
  }
  if (iVar10 - 0xaaU < 2) {
    if (nop == 0 && iVar10 != 0xab) {
      return MIR_OP_INT;
    }
    goto LAB_00132c5e;
  }
  if (iVar10 != 0xb5) goto LAB_00132d4b;
  if (insn->ops[0].field_0x8 != '\x03') {
    __assert_fail("insn->ops[0].mode == MIR_OP_INT",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x842,"MIR_op_mode_t MIR_insn_op_mode(MIR_context_t, MIR_insn_t, size_t, int *)")
    ;
  }
  pVVar3 = ctx->unspec_protos;
  if (pVVar3 == (VARR_MIR_proto_t *)0x0) {
    MIR_insn_op_mode_cold_2();
LAB_00132e43:
    __assert_fail("insn->ops[0].u.u < (VARR_MIR_proto_tlength (ctx->unspec_protos))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x843,"MIR_op_mode_t MIR_insn_op_mode(MIR_context_t, MIR_insn_t, size_t, int *)")
    ;
  }
  uVar16 = insn->ops[0].u.u;
  if (pVVar3->els_num <= uVar16) goto LAB_00132e43;
  ppMVar11 = pVVar3->varr;
  if (ppMVar11 != (MIR_proto_t *)0x0) {
    ppMVar11 = ppMVar11 + uVar16;
    uVar16 = 1;
    goto LAB_00132cb7;
  }
  MIR_insn_op_mode_cold_1();
  plVar5 = (long *)extraout_RDX[0xf];
  psVar6 = (size_t *)*plVar5;
  if (psVar6 == (size_t *)0x0) {
LAB_00132f60:
    find_rd_by_reg_cold_3();
    ppMVar11 = unaff_RBX;
  }
  else if ((void *)psVar6[2] != (void *)0x0) {
    sVar13 = *psVar6;
    uVar16 = sVar13 + 1;
    if (psVar6[1] < uVar16) {
      sVar15 = (uVar16 >> 1) + uVar16;
      pvVar12 = realloc((void *)psVar6[2],sVar15 * 0x18);
      psVar6[2] = (size_t)pvVar12;
      psVar6[1] = sVar15;
    }
    unaff_RBP = (ulong)insn & 0xffffffff;
    sVar15 = *psVar6;
    sVar7 = psVar6[2];
    *psVar6 = sVar15 + 1;
    *(undefined4 *)(sVar7 + sVar15 * 0x18) = 6;
    *(int *)(sVar7 + 4 + sVar15 * 0x18) = (int)insn;
    *(undefined8 *)(sVar7 + 8 + sVar15 * 0x18) = 0;
    iVar10 = HTAB_size_t_do((HTAB_size_t *)plVar5[3],sVar13,HTAB_FIND,(size_t *)aiStack_78);
    insn = (MIR_insn_t_conflict)*plVar5;
    unaff_R14 = extraout_RDX;
    if (iVar10 == 0) goto LAB_00132f6a;
    if (((insn != (MIR_insn_t_conflict)0x0) &&
        (pMVar8 = (insn->insn_link).next, pMVar8 != (MIR_insn_t)0x0)) && (insn->data != (void *)0x0)
       ) {
      insn->data = (void *)((long)insn->data + -1);
      return (int)pMVar8 + aiStack_78[0] * 0x18;
    }
    find_rd_by_reg_cold_1();
    unaff_RBX = ppMVar11;
    goto LAB_00132f60;
  }
  find_rd_by_reg_cold_2();
LAB_00132f6a:
  VARR_reg_desc_tpop(&rStack_70,(VARR_reg_desc_t *)insn);
  uVar16 = 0xf;
  (*(code *)ppMVar11[2])(0xf,"undeclared reg %u of func %s",unaff_RBP & 0xffffffff,*unaff_R14);
  if ((uint)uVar16 < 0xe) {
    return *(int *)(&DAT_001aea70 + (uVar16 & 0xffffffff) * 4) + 0x1aea70;
  }
  return 0x1b05a6;
}

Assistant:

MIR_op_mode_t MIR_insn_op_mode (MIR_context_t ctx, MIR_insn_t insn, size_t nop, int *out_p) {
  MIR_insn_code_t code = insn->code;
  size_t nargs, nops = MIR_insn_nops (ctx, insn);
  unsigned mode;

  *out_p = FALSE; /* to remove unitialized warning */
  if (nop >= nops) return MIR_OP_BOUND;
  mir_assert (out_p != NULL);
  switch (code) {
  case MIR_RET:
  case MIR_SWITCH:
    /* should be already checked in MIR_finish_func */
    return nop == 0 && code != MIR_RET ? MIR_OP_INT : insn->ops[nop].mode;
  case MIR_ADDR:
  case MIR_ADDR8:
  case MIR_ADDR16:
  case MIR_ADDR32: *out_p = nop == 0; return nop == 0 ? MIR_OP_INT : insn->ops[nop].mode;
  case MIR_PHI: *out_p = nop == 0; return insn->ops[nop].mode;
  case MIR_USE: return insn->ops[nop].mode;
  case MIR_CALL:
  case MIR_INLINE:
  case MIR_UNSPEC: {
    MIR_op_t proto_op;
    MIR_proto_t proto;
    size_t args_start;

    if (code == MIR_UNSPEC) {
      args_start = 1;
      mir_assert (insn->ops[0].mode == MIR_OP_INT);
      mir_assert (insn->ops[0].u.u < VARR_LENGTH (MIR_proto_t, unspec_protos));
      proto = VARR_GET (MIR_proto_t, unspec_protos, insn->ops[0].u.u);
    } else {
      args_start = 2;
      proto_op = insn->ops[0];
      mir_assert (proto_op.mode == MIR_OP_REF && proto_op.u.ref->item_type == MIR_proto_item);
      proto = proto_op.u.ref->u.proto;
    }
    *out_p = args_start <= nop && nop < proto->nres + args_start;
    nargs
      = proto->nres + args_start + (proto->args == NULL ? 0 : VARR_LENGTH (MIR_var_t, proto->args));
    if (proto->vararg_p && nop >= nargs) return MIR_OP_UNDEF; /* unknown */
    mir_assert (nops >= nargs && (proto->vararg_p || nops == nargs));
    if (nop == 0) return insn->ops[nop].mode;
    if (nop == 1 && code != MIR_UNSPEC) return MIR_OP_INT; /* call func addr */
    if (args_start <= nop && nop < proto->nres + args_start)
      return type2mode (proto->res_types[nop - args_start]);
    return type2mode (VARR_GET (MIR_var_t, proto->args, nop - args_start - proto->nres).type);
  }
  default:
    mode = insn_descs[code].op_modes[nop];
    if ((mode & OUT_FLAG) == 0) return mode;
    *out_p = TRUE;
    return mode ^ OUT_FLAG;
  }
}